

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignum.cpp
# Opt level: O2

char * CVmObjBigNum::compute_init_2op(vm_val_t *result,char *ext1,char *ext2)

{
  byte bVar1;
  char *pcVar2;
  ushort uVar3;
  vm_obj_id_t vVar4;
  byte bVar5;
  byte *pbVar6;
  size_t digits;
  
  pbVar6 = (byte *)(ext1 + 4);
  if ((ext1[4] & 6U) == 0) {
    uVar3 = *(ushort *)ext1;
    if (*(ushort *)ext1 < *(ushort *)ext2) {
      uVar3 = *(ushort *)ext2;
    }
    if ((ext2[4] & 6U) == 0) {
      digits = (size_t)uVar3;
      goto LAB_0025f2a4;
    }
  }
  digits = 1;
LAB_0025f2a4:
  vVar4 = create(0,digits);
  result->typ = VM_OBJ;
  (result->val).obj = vVar4;
  pcVar2 = *(char **)((long)&G_obj_table_X.pages_[vVar4 >> 0xc][vVar4 & 0xfff].ptr_ + 8);
  bVar5 = *pbVar6 & 6;
  if (bVar5 == 0) {
    bVar5 = ext2[4] & 6;
    if (bVar5 == 0) {
      return pcVar2;
    }
    pbVar6 = (byte *)(ext2 + 4);
  }
  bVar1 = pcVar2[4];
  pcVar2[4] = bVar1 & 0xf9 | bVar5;
  pcVar2[4] = bVar1 & 0xf8 | bVar5 | *pbVar6 & 1;
  return (char *)0x0;
}

Assistant:

char *CVmObjBigNum::compute_init_2op(VMG_ vm_val_t *result,
                                     const char *ext1, const char *ext2)
{
    size_t new_prec;
    char *new_ext;

    /* get the greater precision - this is the precision of the result */
    new_prec = get_prec(ext1);
    if (get_prec(ext2) > new_prec)
        new_prec = get_prec(ext2);

    /* 
     *   if either operand is not an ordinary number, we need minimal
     *   precision to represent the result, since we don't actually need
     *   to store a number 
     */
    if (is_nan(ext1) || is_nan(ext2))
        new_prec = 1;

    /* allocate a new object with the required precision */
    result->set_obj(create(vmg_ FALSE, new_prec));

    /* get the extension buffer */
    new_ext = get_objid_ext(vmg_ result->val.obj);

    /* check the first value for NAN/INF conditions */
    if (get_type(ext1) != VMBN_T_NUM)
    {
        /* set the result to the same non-number type and sign */
        set_type(new_ext, get_type(ext1));
        set_neg(new_ext, get_neg(ext1));

        /* indicate that no further calculation is necessary */
        return 0;
    }

    /* check the second number for NAN/INF conditions */
    if (get_type(ext2) != VMBN_T_NUM)
    {
        /* set the result to the same non-number type and sign */
        set_type(new_ext, get_type(ext2));
        set_neg(new_ext, get_neg(ext2));

        /* indicate that no further calculation is necessary */
        return 0;
    }

    /* the operands are valid - return the new extension buffer */
    return new_ext;
}